

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowManager.cpp
# Opt level: O0

bool __thiscall gui::CWindowManager::Draw(CWindowManager *this,IFrameBuffer *fb,TRect *dirtyRect)

{
  TPoint TVar1;
  int x0;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  element_type *peVar8;
  TRect *pTVar9;
  TPoint TVar10;
  TPoint TVar11;
  element_type *peVar12;
  undefined1 in_R9B;
  TRect client;
  TRect TVar13;
  undefined1 local_8c [8];
  TRect rect;
  int y;
  int x;
  undefined1 local_50 [8];
  CImageDataPtr cursor;
  bool dirty;
  TRect *dirtyRect_local;
  IFrameBuffer *fb_local;
  CWindowManager *this_local;
  
  peVar8 = std::__shared_ptr_access<gui::CWindow,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::CWindow,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->m_desktop);
  pTVar9 = CWindow::GetRect(peVar8);
  unique0x00012000 = pTVar9->p0;
  TVar1 = pTVar9->p1;
  TVar10 = (TPoint)std::__shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(this->m_desktop).
                               super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>);
  TVar13.p1 = TVar10;
  TVar13.p0 = TVar1;
  bVar2 = DrawWindow((gui *)fb,(IFrameBuffer *)stack0xffffffffffffffc4,TVar13,(CWindow *)0x0,
                     (bool)in_R9B);
  if ((bVar2) || ((this->m_mouseDirty & 1U) != 0)) {
    std::__shared_ptr_access<gui::CCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::CCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &this->m_cursor);
    CCursor::GetCursor((CCursor *)local_50);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    if (bVar3) {
      TVar1 = (this->m_oldMouseRect).p0;
      TVar10 = (this->m_oldMouseRect).p1;
      TVar11 = (TPoint)std::__shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>::get
                                 (&(this->m_desktop).
                                   super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>);
      client.p1 = TVar11;
      client.p0 = TVar10;
      DrawWindow((gui *)fb,(IFrameBuffer *)TVar1,client,(CWindow *)0x1,(bool)in_R9B);
      iVar5 = (this->m_mousePosition).x;
      peVar12 = std::__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
      iVar4 = CImageData::GetXHotspot(peVar12);
      rect.p1.y = iVar5 - iVar4;
      iVar5 = (this->m_mousePosition).y;
      peVar12 = std::__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
      iVar4 = CImageData::GetYHotspot(peVar12);
      x0 = rect.p1.y;
      iVar5 = iVar5 - iVar4;
      rect.p1.x = iVar5;
      peVar12 = std::__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
      iVar6 = CImageData::GetWidth(peVar12);
      iVar4 = rect.p1.x;
      peVar12 = std::__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
      iVar7 = CImageData::GetHeight(peVar12);
      TRect::TRect((TRect *)local_8c,x0,iVar5,x0 + iVar6,iVar4 + iVar7);
      peVar12 = std::__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gui::CImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
      CImageData::Draw(peVar12,fb,rect.p1.y,rect.p1.x);
      TVar13 = TRect::Union(&this->m_oldMouseRect,(TRect *)local_8c);
      *dirtyRect = TVar13;
      this->m_mouseDirty = false;
      (this->m_oldMouseRect).p0.x = local_8c._0_4_;
      (this->m_oldMouseRect).p0.y = local_8c._4_4_;
      (this->m_oldMouseRect).p1 = rect.p0;
    }
    if (bVar2) {
      peVar8 = std::__shared_ptr_access<gui::CWindow,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<gui::CWindow,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_desktop);
      pTVar9 = CWindow::GetRect(peVar8);
      dirtyRect->p0 = pTVar9->p0;
      dirtyRect->p1 = pTVar9->p1;
    }
    this_local._7_1_ = true;
    std::shared_ptr<gui::CImageData>::~shared_ptr((shared_ptr<gui::CImageData> *)local_50);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CWindowManager::Draw(IFrameBuffer &fb, TRect &dirtyRect) {
    auto dirty = DrawWindow(fb, m_desktop->GetRect(), *m_desktop.get(), false);
    if (!dirty && !m_mouseDirty) {
        return false;
    }

    // TODO: handle hotspot
    auto cursor = m_cursor->GetCursor();
    if (cursor) {
        // Clear the old pointer first
        DrawWindow(fb, m_oldMouseRect, *m_desktop.get(), true);

        // Draw the new pointer
        auto x = m_mousePosition.x - cursor->GetXHotspot();
        auto y = m_mousePosition.y - cursor->GetYHotspot();
        TRect rect(x, y, x + cursor->GetWidth(), y + cursor->GetHeight());

        cursor->Draw(fb, x, y);
        dirtyRect = TRect::Union(m_oldMouseRect, rect);
        m_mouseDirty = false;
        m_oldMouseRect = rect;
    }

    if (dirty) {
        dirtyRect = m_desktop->GetRect();
    }

    return true;
}